

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  long lVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  uchar *__src;
  size_t sVar5;
  byte bVar6;
  long lVar7;
  uchar *puVar8;
  long lVar9;
  ulong uVar10;
  uchar uVar11;
  uint uVar12;
  ulong uVar13;
  uchar *local_f0;
  int local_e4;
  long lStack_e0;
  int zlen;
  int *local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  uchar *local_a0;
  int *local_98;
  int local_8c;
  int local_88;
  int local_84;
  uchar *local_80;
  uchar *local_78;
  size_t local_70;
  uchar *local_68;
  long local_60;
  int local_58;
  uint local_54;
  long local_50;
  int local_44;
  int local_40;
  int local_3c;
  uchar *local_38;
  
  uVar12 = n * x;
  if (stride_bytes == 0) {
    stride_bytes = uVar12;
  }
  local_88 = (uVar12 + 1) * y;
  local_a0 = pixels;
  local_84 = x;
  local_54 = y;
  local_68 = (uchar *)malloc((long)local_88);
  if (local_68 != (uchar *)0x0) {
    local_70 = (size_t)(int)uVar12;
    local_98 = out_len;
    __ptr = malloc(local_70);
    if (__ptr == (void *)0x0) {
      free(local_68);
    }
    else {
      local_50 = (long)stride_bytes;
      uVar13 = 0;
      uVar10 = 0;
      if (0 < n) {
        uVar10 = (ulong)(uint)n;
      }
      local_60 = (long)n;
      local_d0 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        local_d0 = uVar13;
      }
      local_c0 = 0;
      if (0 < (int)local_54) {
        local_c0 = (ulong)local_54;
      }
      local_b8 = (long)(int)(uVar12 + 1);
      local_b0 = -local_50;
      puVar8 = local_a0;
      local_a8 = uVar10;
      for (; uVar13 != local_c0; uVar13 = uVar13 + 1) {
        local_d8 = stbi_write_png_to_mem::mapping;
        if (uVar13 == 0) {
          local_d8 = stbi_write_png_to_mem::firstmap;
        }
        local_38 = local_a0 + uVar13 * local_50;
        local_80 = puVar8 + local_b0;
        local_58 = 0x7fffffff;
        local_3c = 0;
        iVar4 = 0;
        sVar5 = local_70;
        lVar7 = local_60;
        local_c8 = uVar13;
        local_78 = puVar8;
        while (uVar13 = local_c8, iVar4 != 2) {
          iVar3 = local_3c;
          if (iVar4 == 0) {
            iVar3 = 0;
          }
          local_44 = local_3c;
          local_40 = local_58;
          lVar9 = (long)iVar3;
          local_8c = iVar4;
          while (lVar9 < 5) {
            iVar4 = local_d8[lVar9];
            lStack_e0 = lVar9;
            for (uVar13 = 0; lVar9 = lVar7, uVar10 != uVar13; uVar13 = uVar13 + 1) {
              switch(iVar4) {
              case 0:
              case 1:
              case 5:
              case 6:
                uVar11 = puVar8[uVar13];
                break;
              case 2:
                uVar11 = puVar8[uVar13] - local_80[uVar13];
                break;
              case 3:
                uVar11 = puVar8[uVar13];
                bVar6 = local_80[uVar13] >> 1;
                goto LAB_00108f0d;
              case 4:
                uVar11 = puVar8[uVar13];
                bVar6 = stbiw__paeth(0,(uint)local_80[uVar13],0);
                sVar5 = local_70;
                lVar7 = local_60;
                puVar8 = local_78;
LAB_00108f0d:
                uVar11 = uVar11 - bVar6;
                break;
              default:
                goto switchD_00108eb7_default;
              }
              *(uchar *)((long)__ptr + uVar13) = uVar11;
switchD_00108eb7_default:
            }
            for (; lVar9 < (long)sVar5; lVar9 = lVar9 + 1) {
              switch(iVar4) {
              case 0:
                uVar11 = local_38[lVar9];
                break;
              case 1:
              case 6:
                uVar11 = local_38[lVar9];
                lVar1 = lVar7;
                goto LAB_00108fe7;
              case 2:
                uVar11 = local_38[lVar9];
                lVar1 = local_50;
LAB_00108fe7:
                uVar11 = uVar11 - local_38[lVar9 - lVar1];
                break;
              case 3:
                uVar11 = local_38[lVar9] -
                         (char)((uint)local_38[lVar9 - local_50] + (uint)local_38[lVar9 - lVar7] >>
                               1);
                break;
              case 4:
                uVar11 = local_38[lVar9];
                bVar6 = stbiw__paeth((uint)local_38[lVar9 - lVar7],(uint)local_38[lVar9 - local_50],
                                     (uint)local_38[(lVar9 - local_50) - lVar7]);
                sVar5 = local_70;
                lVar7 = local_60;
                puVar8 = local_78;
                goto LAB_00108fc9;
              case 5:
                uVar11 = local_38[lVar9];
                bVar6 = local_38[lVar9 - lVar7] >> 1;
LAB_00108fc9:
                uVar11 = uVar11 - bVar6;
                break;
              default:
                goto switchD_00108f36_default;
              }
              *(uchar *)((long)__ptr + lVar9) = uVar11;
switchD_00108f36_default:
            }
            uVar10 = local_a8;
            if (local_8c != 0) goto LAB_0010906e;
            iVar4 = 0;
            for (uVar13 = 0; local_d0 != uVar13; uVar13 = uVar13 + 1) {
              bVar6 = (char)*(byte *)((long)__ptr + uVar13) >> 7;
              iVar4 = iVar4 + (uint)(byte)((*(byte *)((long)__ptr + uVar13) ^ bVar6) - bVar6);
            }
            if (iVar4 < local_40) {
              local_44 = (int)lStack_e0;
              local_40 = iVar4;
            }
            lVar9 = lStack_e0 + 1;
          }
          local_3c = local_44;
          local_58 = local_40;
LAB_0010906e:
          iVar4 = local_8c + 1;
        }
        local_68[local_c8 * local_b8] = (uchar)local_3c;
        memcpy(local_68 + local_c8 * local_b8 + 1,__ptr,sVar5);
        puVar8 = local_78 + local_50;
      }
      free(__ptr);
      puVar8 = local_68;
      __src = stbi_zlib_compress(local_68,local_88,&local_e4,8);
      free(puVar8);
      sVar5 = (size_t)local_e4;
      puVar8 = (uchar *)malloc(sVar5 + 0x39);
      if (puVar8 != (uchar *)0x0) {
        *local_98 = (int)(sVar5 + 0x39);
        puVar8[0] = 0x89;
        puVar8[1] = 'P';
        puVar8[2] = 'N';
        puVar8[3] = 'G';
        puVar8[4] = '\r';
        puVar8[5] = '\n';
        puVar8[6] = '\x1a';
        puVar8[7] = '\n';
        puVar8[8] = '\0';
        puVar8[9] = '\0';
        puVar8[10] = '\0';
        puVar8[0xb] = '\r';
        puVar8[0xc] = 'I';
        puVar8[0xd] = 'H';
        puVar8[0xe] = 'D';
        puVar8[0xf] = 'R';
        puVar8[0x10] = (uchar)((uint)local_84 >> 0x18);
        puVar8[0x11] = (uchar)((uint)local_84 >> 0x10);
        puVar8[0x12] = (uchar)((uint)local_84 >> 8);
        puVar8[0x13] = (uchar)local_84;
        puVar8[0x14] = (uchar)(local_54 >> 0x18);
        puVar8[0x15] = (uchar)(local_54 >> 0x10);
        puVar8[0x16] = (uchar)(local_54 >> 8);
        puVar8[0x17] = (uchar)local_54;
        puVar8[0x18] = '\b';
        puVar8[0x19] = (&DAT_00111160)[local_60 * 4];
        puVar8[0x1a] = '\0';
        puVar8[0x1b] = '\0';
        local_f0 = puVar8 + 0x1d;
        puVar8[0x1c] = '\0';
        stbiw__wpcrc(&local_f0,0xd);
        puVar2 = local_f0;
        *local_f0 = (uchar)((uint)local_e4 >> 0x18);
        local_f0[1] = (uchar)((uint)local_e4 >> 0x10);
        local_f0[2] = (uchar)((uint)local_e4 >> 8);
        local_f0[3] = (uchar)local_e4;
        local_f0[4] = 'I';
        local_f0[5] = 'D';
        local_f0[6] = 'A';
        local_f0[7] = 'T';
        memmove(local_f0 + 8,__src,sVar5);
        local_f0 = puVar2 + sVar5 + 8;
        free(__src);
        stbiw__wpcrc(&local_f0,local_e4);
        local_f0[0] = '\0';
        local_f0[1] = '\0';
        local_f0[2] = '\0';
        local_f0[3] = '\0';
        local_f0[4] = 'I';
        local_f0[5] = 'E';
        local_f0[6] = 'N';
        local_f0[7] = 'D';
        local_f0 = local_f0 + 8;
        stbiw__wpcrc(&local_f0,0);
        if (local_f0 == puVar8 + *local_98) {
          return puVar8;
        }
        __assert_fail("o == out + *out_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image_write.h"
                      ,0x2b3,
                      "unsigned char *stbi_write_png_to_mem(unsigned char *, int, int, int, int, int *)"
                     );
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *stbi_write_png_to_mem(unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int i,j,k,p,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      static int mapping[] = { 0,1,2,3,4 };
      static int firstmap[] = { 0,1,0,5,6 };
      int *mymap = j ? mapping : firstmap;
      int best = 0, bestval = 0x7fffffff;
      for (p=0; p < 2; ++p) {
         for (k= p?best:0; k < 5; ++k) {
            int type = mymap[k],est=0;
            unsigned char *z = pixels + stride_bytes*j;
            for (i=0; i < n; ++i)
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - (z[i-stride_bytes]>>1); break;
                  case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-stride_bytes],0)); break;
                  case 5: line_buffer[i] = z[i]; break;
                  case 6: line_buffer[i] = z[i]; break;
               }
            for (i=n; i < x*n; ++i) {
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i] - z[i-n]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - ((z[i-n] + z[i-stride_bytes])>>1); break;
                  case 4: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-stride_bytes], z[i-stride_bytes-n]); break;
                  case 5: line_buffer[i] = z[i] - (z[i-n]>>1); break;
                  case 6: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
               }
            }
            if (p) break;
            for (i=0; i < x*n; ++i)
               est += abs((signed char) line_buffer[i]);
            if (est < bestval) { bestval = est; best = k; }
         }
      }
      // when we get here, best contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) best;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, 8); // increase 8 to get smaller but use more memory
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = (unsigned char) ctype[n];
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}